

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O0

ssize_t __thiscall
Imf_3_2::anon_unknown_0::PtrIStream::read(PtrIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  ostream *poVar1;
  InputExc *pIVar2;
  undefined4 in_register_00000034;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  stringstream local_338 [16];
  ostream local_328 [392];
  stringstream local_1a0 [16];
  ostream local_190 [380];
  int local_14;
  void *local_10;
  PtrIStream *local_8;
  
  local_10 = (void *)CONCAT44(in_register_00000034,__fd);
  local_14 = (int)__buf;
  local_8 = this;
  if (local_14 < 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1a0);
    poVar1 = (ostream *)std::ostream::operator<<(local_190,local_14);
    std::operator<<(poVar1," bytes requested from stream");
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar2,local_1a0);
    __cxa_throw(pIVar2,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  if (this->end < this->current + local_14) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_338);
    poVar1 = std::operator<<(local_328,"Early end of file: requesting ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,(long)this->end - (long)(this->current + local_14));
    std::operator<<(poVar1," extra bytes after file\n");
    pIVar2 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar2,local_338);
    __cxa_throw(pIVar2,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  memcpy(local_10,this->current,(long)local_14);
  this->current = this->current + local_14;
  return CONCAT71((int7)((ulong)this->current >> 8),this->current != this->end);
}

Assistant:

virtual bool read (char c[/*n*/], int n)
    {
        if (n < 0)
        {
            THROW (
                IEX_NAMESPACE::InputExc, n << " bytes requested from stream");
        }

        if (n + current > end)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: requesting "
                    << end - (n + current) << " extra bytes after file\n");
        }
        memcpy (c, current, n);
        current += n;

        return (current != end);
    }